

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_true>::uintwide_t<long>
          (uintwide_t<64U,_unsigned_short,_void,_true> *this,long v,
          enable_if_t<(std::is_integral<long>::value_&&_std::is_signed<long>::value)> *p_nullparam)

{
  array<unsigned_short,_4UL> local_20;
  
  detail::fixed_static_array<unsigned_short,_4U>::fixed_static_array(&this->values,4);
  if (v < 0) {
    uintwide_t<64u,unsigned_short,void,true>::uintwide_t<unsigned_long>(unsigned_long,std::
    enable_if<(std::is_integral<unsigned_long>::value&&std::is_unsigned<unsigned_long>::
    value)&&((std::numeric_limits<unsigned_long>::digits>std::numeric_limits<unsigned_short>::
    digits)),void>::type__
              (&local_20,-v,
               (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
                *)0x0);
    *&(this->values).super_array<unsigned_short,_4UL>.elems = local_20.elems;
    negate(this);
  }
  else {
    uintwide_t<64u,unsigned_short,void,true>::uintwide_t<unsigned_long>(unsigned_long,std::
    enable_if<(std::is_integral<unsigned_long>::value&&std::is_unsigned<unsigned_long>::
    value)&&((std::numeric_limits<unsigned_long>::digits>std::numeric_limits<unsigned_short>::
    digits)),void>::type__
              (&local_20,v,
               (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
                *)0x0);
    *&(this->values).super_array<unsigned_short,_4UL>.elems = local_20.elems;
  }
  return;
}

Assistant:

constexpr uintwide_t(const SignedIntegralType v, // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
                         std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                           && std::is_signed  <SignedIntegralType>::value)>* p_nullparam = nullptr)
      : values(number_of_limbs)
    {
      static_cast<void>(p_nullparam == nullptr);

      using local_signed_integral_type   = SignedIntegralType;
      using local_unsigned_integral_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_signed_integral_type>::digits + 1)>::exact_unsigned_type;

      const auto v_is_neg = (v < static_cast<local_signed_integral_type>(0));

      const local_unsigned_integral_type u =
        ((!v_is_neg) ? static_cast<local_unsigned_integral_type>(v)
                     : static_cast<local_unsigned_integral_type>(detail::negate(v)));

      operator=(uintwide_t(u));

      if(v_is_neg) { negate(); }
    }